

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.cpp
# Opt level: O0

int __thiscall
jrtplib::RTCPCompoundPacketBuilder::InitBuild(RTCPCompoundPacketBuilder *this,size_t maxpacketsize)

{
  size_t maxpacketsize_local;
  RTCPCompoundPacketBuilder *this_local;
  
  if ((this->arebuilding & 1U) == 0) {
    if ((this->super_RTCPCompoundPacket).compoundpacket == (uint8_t *)0x0) {
      if (maxpacketsize < 600) {
        this_local._4_4_ = -0x27;
      }
      else {
        this->maximumpacketsize = maxpacketsize;
        this->buffer = (uint8_t *)0x0;
        this->external = false;
        this->byesize = 0;
        this->appsize = 0;
        this->arebuilding = true;
        this_local._4_4_ = 0;
      }
    }
    else {
      this_local._4_4_ = -0x20;
    }
  }
  else {
    this_local._4_4_ = -0x1f;
  }
  return this_local._4_4_;
}

Assistant:

int RTCPCompoundPacketBuilder::InitBuild(size_t maxpacketsize)
{
	if (arebuilding)
		return ERR_RTP_RTCPCOMPPACKBUILDER_ALREADYBUILDING;
	if (compoundpacket)
		return ERR_RTP_RTCPCOMPPACKBUILDER_ALREADYBUILT;

	if (maxpacketsize < RTP_MINPACKETSIZE)
		return ERR_RTP_RTCPCOMPPACKBUILDER_MAXPACKETSIZETOOSMALL;
	
	maximumpacketsize = maxpacketsize;
	buffer = 0;
	external = false;
	byesize = 0;
	appsize = 0;
#ifdef RTP_SUPPORT_RTCPUNKNOWN
	unknownsize = 0;
#endif // RTP_SUPPORT_RTCPUNKNOWN 
	
	arebuilding = true;
	return 0;
}